

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# accessors.h
# Opt level: O0

upb_Message *
upb_Message_GetOrCreateMutableMessage
          (upb_Message *msg,upb_MiniTable *mini_table,upb_MiniTableField *f,upb_Arena *arena)

{
  bool bVar1;
  upb_CType uVar2;
  upb_MiniTable *m;
  upb_MiniTable *sub_mini_table;
  upb_Message *sub_message;
  upb_Arena *arena_local;
  upb_MiniTableField *f_local;
  upb_MiniTable *mini_table_local;
  upb_Message *msg_local;
  
  if (arena == (upb_Arena *)0x0) {
    __assert_fail("arena",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/accessors.h"
                  ,0x21c,
                  "struct upb_Message *upb_Message_GetOrCreateMutableMessage(struct upb_Message *, const upb_MiniTable *, const upb_MiniTableField *, upb_Arena *)"
                 );
  }
  uVar2 = upb_MiniTableField_CType(f);
  if (uVar2 == kUpb_CType_Message) {
    bVar1 = upb_MiniTableField_IsExtension(f);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      __assert_fail("!upb_MiniTableField_IsExtension(f)",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/accessors.h"
                    ,0x21e,
                    "struct upb_Message *upb_Message_GetOrCreateMutableMessage(struct upb_Message *, const upb_MiniTable *, const upb_MiniTableField *, upb_Arena *)"
                   );
    }
    sub_mini_table =
         *(upb_MiniTable **)
          ((long)&msg->field_0 + (long)(int)(uint)f->offset_dont_copy_me__upb_internal_use_only);
    if (sub_mini_table == (upb_MiniTable *)0x0) {
      m = upb_MiniTable_SubMessage(mini_table,f);
      if (m == (upb_MiniTable *)0x0) {
        __assert_fail("sub_mini_table",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/accessors.h"
                      ,0x224,
                      "struct upb_Message *upb_Message_GetOrCreateMutableMessage(struct upb_Message *, const upb_MiniTable *, const upb_MiniTableField *, upb_Arena *)"
                     );
      }
      sub_mini_table = (upb_MiniTable *)_upb_Message_New(m,arena);
      *(upb_MiniTable **)
       ((long)&msg->field_0 + (long)(int)(uint)f->offset_dont_copy_me__upb_internal_use_only) =
           sub_mini_table;
      _upb_Message_SetPresence_dont_copy_me__upb_internal_use_only(msg,f);
    }
    return (upb_Message *)sub_mini_table;
  }
  __assert_fail("upb_MiniTableField_CType(f) == kUpb_CType_Message",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/accessors.h"
                ,0x21d,
                "struct upb_Message *upb_Message_GetOrCreateMutableMessage(struct upb_Message *, const upb_MiniTable *, const upb_MiniTableField *, upb_Arena *)"
               );
}

Assistant:

UPB_API_INLINE struct upb_Message* upb_Message_GetOrCreateMutableMessage(
    struct upb_Message* msg, const upb_MiniTable* mini_table,
    const upb_MiniTableField* f, upb_Arena* arena) {
  UPB_ASSERT(arena);
  UPB_ASSUME(upb_MiniTableField_CType(f) == kUpb_CType_Message);
  UPB_ASSUME(!upb_MiniTableField_IsExtension(f));
  struct upb_Message* sub_message =
      *UPB_PTR_AT(msg, f->UPB_ONLYBITS(offset), struct upb_Message*);
  if (!sub_message) {
    const upb_MiniTable* sub_mini_table =
        upb_MiniTable_SubMessage(mini_table, f);
    UPB_ASSERT(sub_mini_table);
    sub_message = _upb_Message_New(sub_mini_table, arena);
    *UPB_PTR_AT(msg, f->UPB_ONLYBITS(offset), struct upb_Message*) =
        sub_message;
    UPB_PRIVATE(_upb_Message_SetPresence)(msg, f);
  }
  return sub_message;
}